

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_consume(nghttp2_session *session,int32_t stream_id,size_t size)

{
  int iVar1;
  int iVar2;
  nghttp2_stream *stream;
  
  if (stream_id == 0) {
    return -0x1f5;
  }
  iVar1 = -0x207;
  if (((session->opt_flags & 1) != 0) &&
     (iVar1 = session_update_connection_consumed_size(session,size), -0x385 < iVar1)) {
    stream = nghttp2_session_get_stream(session,stream_id);
    if (stream == (nghttp2_stream *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar2 = session_update_stream_consumed_size(session,stream,size);
      iVar1 = 0;
      if (iVar2 < -900) {
        iVar1 = iVar2;
      }
    }
  }
  return iVar1;
}

Assistant:

int nghttp2_session_consume(nghttp2_session *session, int32_t stream_id,
                            size_t size) {
  int rv;
  nghttp2_stream *stream;

  if (stream_id == 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (!(session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE)) {
    return NGHTTP2_ERR_INVALID_STATE;
  }

  rv = session_update_connection_consumed_size(session, size);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  stream = nghttp2_session_get_stream(session, stream_id);

  if (!stream) {
    return 0;
  }

  rv = session_update_stream_consumed_size(session, stream, size);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  return 0;
}